

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

result_type __thiscall
WellTestCase<Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<-21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<-13>,_Detail::M3<13>,_Detail::M2<-10>,_Detail::M2<-5>,_Detail::M3<13>,_Detail::NoTempering>,_3076024310U>
::generate(WellTestCase<Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<_21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<_13>,_Detail::M3<13>,_Detail::M2<_10>,_Detail::M2<_5>,_Detail::M3<13>,_Detail::NoTempering>,_3076024310U>
           *this)

{
  int local_70;
  result_type local_6c;
  int iterations;
  result_type x;
  uint *p;
  uint local_58 [2];
  uint state [17];
  WellTestCase<Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<_21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<_13>,_Detail::M3<13>,_Detail::M2<_10>,_Detail::M2<_5>,_Detail::M3<13>,_Detail::NoTempering>,_3076024310U>
  *this_local;
  
  p._4_4_ = 1;
  unique0x10000090 = this;
  std::uninitialized_fill_n<unsigned_int*,unsigned_long,int>(local_58,0x11,(int *)((long)&p + 4));
  _iterations = local_58;
  Well<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,Detail::M3<-21>,Detail::M3<6>,Detail::M0,Detail::M3<-13>,Detail::M3<13>,Detail::M2<-10>,Detail::M2<-5>,Detail::M3<13>,Detail::NoTempering>
  ::seed<unsigned_int*>
            ((Well<unsigned_int,32ul,17ul,23ul,11ul,10ul,7ul,Detail::M3<_21>,Detail::M3<6>,Detail::M0,Detail::M3<_13>,Detail::M3<13>,Detail::M2<_10>,Detail::M2<_5>,Detail::M3<13>,Detail::NoTempering>
              *)this,(uint **)&iterations,state + 0xf);
  local_6c = 0;
  local_70 = 1000000000;
  while (0 < local_70) {
    local_6c = Well<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_Detail::M3<-21>,_Detail::M3<6>,_Detail::M0,_Detail::M3<-13>,_Detail::M3<13>,_Detail::M2<-10>,_Detail::M2<-5>,_Detail::M3<13>,_Detail::NoTempering>
               ::operator()(&this->rng);
    local_70 = local_70 + -1;
  }
  return local_6c;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, RandomNumberGenerator::state_size, 1);

        unsigned* p = state;
        rng.seed(p, p + RandomNumberGenerator::state_size);

        result_type x = 0;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }